

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# si_function.hpp
# Opt level: O0

double __thiscall
sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::d
          (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this,int component,
          vector *p)

{
  bool bVar1;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_b8;
  Matrix<double,__1,_1,_0,__1,_1> local_a8;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_98;
  Matrix<double,__1,_1,_0,__1,_1> local_88;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_78;
  Matrix<double,__1,_1,_0,__1,_1> local_68 [2];
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_48;
  Matrix<double,__1,_1,_0,__1,_1> local_38;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_28;
  vector *p_local;
  si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *psStack_18;
  int component_local;
  si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this_local;
  
  local_28 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)p;
  p_local._4_4_ = component;
  psStack_18 = this;
  if (((this->_bUseBasisDerivative & 1U) == 0) || (bVar1 = tp_linear::has_derivative(), !bVar1)) {
    if (this->_d[p_local._4_4_] == (cartesian_cubic<float> *)0x0) {
      this_local = (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *)0x0;
    }
    else if ((this->_bForceScale & 1U) == 0) {
      local_98 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                            &this->_mSpaceTransform,local_28);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_88,
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_98);
      this_local = (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *)
                   tp_linear::convolution_sum<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                             ((vector *)&local_88,this->_d[p_local._4_4_]);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_88);
    }
    else {
      local_b8 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                            &this->_mSpaceTransform,local_28);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_a8,
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_b8);
      this_local = (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *)
                   tp_linear::convolution_sum_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                             ((vector *)&local_a8,this->_d[p_local._4_4_],&this->_dBasisScale);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_a8);
    }
  }
  else if ((this->_bForceScale & 1U) == 0) {
    local_48 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->_mSpaceTransform
                          ,local_28);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_38,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_48);
    this_local = (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *)
                 tp_linear::convolution_sum_deriv<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                           ((vector *)&local_38,this->_lattice,(int *)((long)&p_local + 4));
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_38);
  }
  else {
    local_78 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->_mSpaceTransform
                          ,local_28);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,_1,1,0,_1,1> *)local_68,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_78);
    this_local = (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *)
                 tp_linear::convolution_sum_deriv_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                           ((vector *)local_68,this->_lattice,(int *)((long)&p_local + 4),
                            &this->_dBasisScale);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(local_68);
  }
  return (double)this_local;
}

Assistant:

virtual const double d(int component, const vector &p) const {
            if(_bUseBasisDerivative && BF::has_derivative()) {
                if(!_bForceScale)
                    return BF::template convolution_sum_deriv<N, L, BF>(
                            _mSpaceTransform*p,
                            (const L*)_lattice,
                            component);
                return BF::template convolution_sum_deriv_h<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_lattice,
                        component,
                        _dBasisScale);

            }
            if(!_d[component]) return 0;
            if(!_bForceScale)
                return BF::template convolution_sum<N, L, BF>(
                            _mSpaceTransform*p,
                            (const L*)_d[component]);
            return BF::template convolution_sum_h<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_d[component],
                        _dBasisScale);

        }